

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

void xmlSchemaFreeFacet(xmlSchemaFacetPtr facet)

{
  if (facet != (xmlSchemaFacetPtr)0x0) {
    if (facet->val != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(facet->val);
    }
    if (facet->regexp != (xmlRegexpPtr)0x0) {
      xmlRegFreeRegexp(facet->regexp);
    }
    if (facet->annot != (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaFreeAnnot(facet->annot);
    }
    (*xmlFree)(facet);
    return;
  }
  return;
}

Assistant:

void
xmlSchemaFreeFacet(xmlSchemaFacetPtr facet)
{
    if (facet == NULL)
        return;
    if (facet->val != NULL)
        xmlSchemaFreeValue(facet->val);
    if (facet->regexp != NULL)
        xmlRegFreeRegexp(facet->regexp);
    if (facet->annot != NULL)
        xmlSchemaFreeAnnot(facet->annot);
    xmlFree(facet);
}